

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue::IfcPropertyReferenceValue
          (IfcPropertyReferenceValue *this)

{
  IfcPropertyReferenceValue *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xb0,"IfcPropertyReferenceValue");
  IfcSimpleProperty::IfcSimpleProperty
            ((IfcSimpleProperty *)this,&PTR_construction_vtable_24__01071210);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>,
             &PTR_construction_vtable_24__01071258);
  *(undefined8 *)this = 0x1071180;
  *(undefined8 *)&this->field_0xb0 = 0x10711f8;
  *(undefined8 *)&this->field_0x58 = 0x10711a8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>).
  _vptr_ObjectHelper = (_func_int **)0x10711d0;
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>).
         field_0x10);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr(&this->PropertyReference);
  return;
}

Assistant:

IfcPropertyReferenceValue() : Object("IfcPropertyReferenceValue") {}